

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToUni::map_str(CCharmapToUni *this,char *outbuf,size_t outbuflen,char *input_str)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  char *local_30;
  size_t local_28;
  
  local_30 = outbuf;
  local_28 = outbuflen;
  sVar2 = strlen(input_str);
  iVar1 = (*(this->super_CCharmap)._vptr_CCharmap[4])(this,&local_30,&local_28,input_str,sVar2);
  if (local_28 != 0) {
    *local_30 = '\0';
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t CCharmapToUni::map_str(char *outbuf, size_t outbuflen,
                              const char *input_str)
{
    /* map the string to the output buffer */
    size_t output_len = map(&outbuf, &outbuflen, input_str, strlen(input_str));

    /* if there's space remaining in the output buffer, add a null byte */
    if (outbuflen != 0)
        *outbuf = '\0';

    /* return the number of bytes needed for the conversion */
    return output_len;
}